

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O1

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::record_value_if_available<std::ostream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,maybe<pstore::command_line::option_*,_void> *handler,
          maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *value,string *program_name,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  details dVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  option **ppoVar5;
  type *ptVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ostream *poVar8;
  string *psVar9;
  maybe<pstore::command_line::option_*,_void> local_38;
  
  ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->
                      ((maybe<pstore::command_line::option_*,_void> *)this);
  iVar4 = (*(*ppoVar5)->_vptr_option[0xe])();
  if ((char)iVar4 == '\0') {
    if (handler->valid_ != false) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)program_name,*(char **)value,(long)(value->storage_).__align);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Argument \'",0xc);
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->
                          ((maybe<pstore::command_line::option_*,_void> *)this);
      psVar9 = option::name_abi_cxx11_(*ppoVar5);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' does not take a value\n",0x18);
      uVar2 = false;
      goto LAB_0010b6d9;
    }
    ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->
                        ((maybe<pstore::command_line::option_*,_void> *)this);
    iVar4 = (*(*ppoVar5)->_vptr_option[0x10])();
    uVar2 = (undefined1)iVar4;
  }
  else {
    uVar2 = true;
    if (handler->valid_ == false) goto LAB_0010b6d9;
    local_38.valid_ = false;
    dVar1 = *this;
    if (dVar1 == (details)0x1) {
      ptVar6 = (type *)maybe<pstore::command_line::option_*,_void>::operator->
                                 ((maybe<pstore::command_line::option_*,_void> *)this);
      local_38.storage_ = *ptVar6;
    }
    local_38.valid_ = dVar1 == (details)0x1;
    pbVar7 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator->((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)handler);
    bVar3 = handler_set_value(&local_38,pbVar7);
    if (local_38.valid_ == true) {
      local_38.valid_ = false;
    }
    uVar2 = 1;
    if (!bVar3) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)program_name,*(char **)value,(long)(value->storage_).__align);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Unknown value \'",0x11);
      pbVar7 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               ::operator->((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                             *)handler);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
      uVar2 = 0;
    }
  }
  if (*this == (details)0x1) {
    *this = (details)0x0;
  }
LAB_0010b6d9:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = (bool)uVar2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
  valid_ = false;
  if (*this == (details)0x1) {
    ptVar6 = (type *)maybe<pstore::command_line::option_*,_void>::operator->
                               ((maybe<pstore::command_line::option_*,_void> *)this);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    storage_ = *ptVar6;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    valid_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

auto record_value_if_available (maybe<option *> handler,
                                            maybe<std::string> const & value,
                                            std::string const & program_name, ErrorStream & errs)
                -> std::tuple<maybe<option *>, bool> {
                using str = stream_trait<typename ErrorStream::char_type>;
                bool ok = true;
                if ((*handler)->takes_argument ()) {
                    if (value) {
                        if (!handler_set_value (handler, *value)) {
                            errs << str::out_string (program_name)
                                 << str::out_text (": Unknown value '") << str::out_string (*value)
                                 << str::out_text ("'");
                            ok = false;
                        }
                        handler.reset ();
                    } else {
                        // The option takes an argument but we haven't yet seen the value
                        // string.
                    }
                } else {
                    if (value) {
                        // We got a value but don't want one.
                        errs << str::out_string (program_name) << str::out_text (": Argument '")
                             << str::out_string ((*handler)->name ())
                             << str::out_text ("' does not take a value\n");
                        ok = false;
                    } else {
                        ok = (*handler)->add_occurrence ();
                        handler.reset ();
                    }
                }
                return std::make_tuple (std::move (handler), ok);
            }